

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O2

string * __thiscall
duckdb::SQLLogicTestRunner::ReplaceLoopIterator
          (string *__return_storage_ptr__,SQLLogicTestRunner *this,string *text,
          string *loop_iterator_name,string *replacement)

{
  char cVar1;
  reference pvVar2;
  string *psVar3;
  ulong __n;
  string local_1d8;
  string *local_1b8;
  AssertionHandler catchAssertionHandler;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  name_splits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  replacement_splits;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ReusableStringStream local_118;
  string local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60 [32];
  StringRef local_40;
  
  local_1b8 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_80,(string *)replacement);
  ReplaceKeywords((string *)&catchAssertionHandler,this,&local_80);
  std::__cxx11::string::operator=((string *)replacement,(string *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&catchAssertionHandler,",",(allocator *)&local_1d8);
  cVar1 = duckdb::StringUtil::Contains
                    ((string *)loop_iterator_name,(string *)&catchAssertionHandler);
  std::__cxx11::string::~string((string *)&catchAssertionHandler);
  if (cVar1 == '\0') {
    std::__cxx11::string::string(local_100,(string *)text);
    std::operator+(&local_1d8,"${",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   loop_iterator_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &catchAssertionHandler,&local_1d8,"}");
    psVar3 = local_1b8;
    duckdb::StringUtil::Replace(local_1b8,local_100,&catchAssertionHandler,replacement);
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string(local_100);
  }
  else {
    std::__cxx11::string::string((string *)&catchAssertionHandler,",",(allocator *)&local_1d8);
    duckdb::StringUtil::Split((string *)&name_splits,(string *)loop_iterator_name);
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    std::__cxx11::string::string((string *)&catchAssertionHandler,",",(allocator *)&local_1d8);
    duckdb::StringUtil::Split((string *)&replacement_splits,(string *)replacement);
    std::__cxx11::string::~string((string *)&catchAssertionHandler);
    if ((long)name_splits.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)name_splits.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)replacement_splits.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)replacement_splits.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      local_1d8._M_dataplus._M_p = "FAIL";
      local_1d8._M_string_length = 4;
      local_138._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sqlite/sqllogic_test_runner.cpp"
      ;
      local_138._M_string_length = 0x93;
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_1d8,(SourceLineInfo *)&local_138,
                 (StringRef)ZEXT816(0x484131),Normal);
      local_118.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_118.m_index = 0;
      local_118.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_118);
      std::operator+(&local_e0,"foreach loop: number of commas in loop iterator (",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     loop_iterator_name);
      std::operator+(&local_c0,&local_e0,") does not match number of commas in replacement (");
      std::operator+(&local_a0,&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     replacement);
      std::operator+(&local_138,&local_a0,")");
      std::operator<<(local_118.m_oss,(string *)&local_138);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_1d8,&local_118);
      local_40.m_start = local_1d8._M_dataplus._M_p;
      local_40.m_size = local_1d8._M_string_length;
      Catch::AssertionHandler::handleMessage(&catchAssertionHandler,ExplicitFailure,&local_40);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      Catch::ReusableStringStream::~ReusableStringStream(&local_118);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
    }
    for (__n = 0; psVar3 = local_1b8,
        __n < (ulong)((long)name_splits.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)name_splits.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); __n = __n + 1) {
      std::__cxx11::string::string(local_60,(string *)text);
      pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&name_splits,__n);
      std::operator+(&local_138,"${",pvVar2);
      std::operator+(&local_1d8,&local_138,"}");
      pvVar2 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&replacement_splits,__n);
      duckdb::StringUtil::Replace(&catchAssertionHandler,local_60,&local_1d8,pvVar2);
      std::__cxx11::string::operator=((string *)text,(string *)&catchAssertionHandler);
      std::__cxx11::string::~string((string *)&catchAssertionHandler);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string(local_60);
    }
    std::__cxx11::string::string((string *)local_1b8,(string *)text);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&replacement_splits);
    Catch::clara::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name_splits);
  }
  return psVar3;
}

Assistant:

string SQLLogicTestRunner::ReplaceLoopIterator(string text, string loop_iterator_name, string replacement) {
	replacement = ReplaceKeywords(replacement);
	if (StringUtil::Contains(loop_iterator_name, ",")) {
		auto name_splits = StringUtil::Split(loop_iterator_name, ",");
		auto replacement_splits = StringUtil::Split(replacement, ",");
		if (name_splits.size() != replacement_splits.size()) {
			FAIL("foreach loop: number of commas in loop iterator (" + loop_iterator_name +
			     ") does not match number of commas in replacement (" + replacement + ")");
		}
		for (idx_t i = 0; i < name_splits.size(); i++) {
			text = StringUtil::Replace(text, "${" + name_splits[i] + "}", replacement_splits[i]);
		}
		return text;
	} else {
		return StringUtil::Replace(text, "${" + loop_iterator_name + "}", replacement);
	}
}